

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

void __thiscall Jinx::Variant::SetString(Variant *this,StringU16 *value)

{
  String local_38;
  StringU16 *local_18;
  StringU16 *value_local;
  Variant *this_local;
  
  local_18 = value;
  value_local = (StringU16 *)this;
  Impl::ConvertUtf16ToUtf8(&local_38,value);
  SetString(this,&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_38);
  return;
}

Assistant:

inline_t void Variant::SetString(const StringU16 & value)
	{
		SetString(Impl::ConvertUtf16ToUtf8(value));
	}